

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

void __thiscall mkvparser::Cluster::~Cluster(Cluster *this)

{
  long lVar1;
  BlockEntry **ppBVar2;
  long lVar3;
  
  ppBVar2 = this->m_entries;
  lVar1 = this->m_entries_count;
  if (0 < lVar1) {
    for (lVar3 = 0; lVar1 << 3 != lVar3; lVar3 = lVar3 + 8) {
      if (*(long **)((long)ppBVar2 + lVar3) == (long *)0x0) {
        __assert_fail("p",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1acd,"mkvparser::Cluster::~Cluster()");
      }
      (**(code **)(**(long **)((long)ppBVar2 + lVar3) + 8))();
    }
    ppBVar2 = this->m_entries;
  }
  if (ppBVar2 != (BlockEntry **)0x0) {
    operator_delete__(ppBVar2);
    return;
  }
  return;
}

Assistant:

Cluster::~Cluster() {
  if (m_entries_count <= 0) {
    delete[] m_entries;
    return;
  }

  BlockEntry** i = m_entries;
  BlockEntry** const j = m_entries + m_entries_count;

  while (i != j) {
    BlockEntry* p = *i++;
    assert(p);

    delete p;
  }

  delete[] m_entries;
}